

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_trap_t * wasm_func_call(wasm_func_t *f,wasm_val_vec_t *args,wasm_val_vec_t *results)

{
  bool bVar1;
  Func *pFVar2;
  FuncType *pFVar3;
  Store *pSVar4;
  RefPtr<wabt::interp::Trap> local_98;
  Enum local_7c;
  undefined1 local_78 [8];
  Ptr trap;
  Values wabt_results;
  Values wabt_args;
  FuncType *func_type;
  wasm_val_vec_t *results_local;
  wasm_val_vec_t *args_local;
  wasm_func_t *f_local;
  
  pFVar2 = wasm_ref_t::As<wabt::interp::Func>((wasm_ref_t *)f);
  pFVar3 = wabt::interp::Func::type(pFVar2);
  ToWabtValues((Values *)
               &wabt_results.
                super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,args);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_78);
  pFVar2 = wasm_ref_t::As<wabt::interp::Func>((wasm_ref_t *)f);
  pSVar4 = wabt::interp::RefPtr<wabt::interp::Object>::store((RefPtr<wabt::interp::Object> *)f);
  local_7c = (Enum)wabt::interp::Func::Call
                             (pFVar2,pSVar4,
                              (Values *)
                              &wabt_results.
                               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (Values *)&trap.root_index_,(Ptr *)local_78,(Stream *)0x0);
  bVar1 = wabt::Failed((Result)local_7c);
  if (bVar1) {
    f_local = (wasm_func_t *)operator_new(0x18);
    wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr
              (&local_98,(RefPtr<wabt::interp::Trap> *)local_78);
    wasm_trap_t::wasm_trap_t((wasm_trap_t *)f_local,&local_98);
    wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr(&local_98);
  }
  else {
    pSVar4 = wabt::interp::RefPtr<wabt::interp::Object>::store((RefPtr<wabt::interp::Object> *)f);
    FromWabtValues(pSVar4,results,&pFVar3->results,(Values *)&trap.root_index_);
    f_local = (wasm_func_t *)0x0;
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_78);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
             &wabt_results.
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (wasm_trap_t *)f_local;
}

Assistant:

own wasm_trap_t* wasm_func_call(const wasm_func_t* f,
                                const wasm_val_vec_t* args,
                                wasm_val_vec_t* results) {
  // TODO: get some information about the function; name/index
  // TRACE("%d", f->index);

  auto&& func_type = f->As<Func>()->type();
  Values wabt_args = ToWabtValues(args);
  Values wabt_results;
  Trap::Ptr trap;
  if (Failed(
          f->As<Func>()->Call(*f->I.store(), wabt_args, wabt_results, &trap))) {
    return new wasm_trap_t{trap};
  }
  FromWabtValues(*f->I.store(), results, func_type.results, wabt_results);
  return nullptr;
}